

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise::forward
          (ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  size_t _elemsize;
  Layer *pLVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  pointer piVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  char *kptr;
  long lVar20;
  void *pvVar21;
  long lVar22;
  uint uVar23;
  size_type __n;
  long lVar24;
  long lVar25;
  int k;
  int iVar26;
  ulong uVar27;
  int iVar28;
  int j_1;
  int i_2;
  int iVar29;
  long lVar30;
  int sum;
  int iVar31;
  ulong uVar32;
  int q;
  long lVar33;
  ulong uVar34;
  float fVar35;
  long local_200;
  Mat bottom_blob_g;
  void *local_198;
  Mat bottom_blob_int8;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat bottom_blob_unbordered;
  Option opt_g_1;
  Mat bottom_blob_int8_g;
  
  iVar18 = bottom_blob->c;
  if (iVar18 % this->group != 0) {
    return -100;
  }
  if (this->num_output % this->group != 0) {
    return -100;
  }
  iVar28 = bottom_blob->w;
  iVar31 = bottom_blob->h;
  _elemsize = bottom_blob->elemsize;
  uVar9 = (this->kernel_w + -1) * this->dilation_w;
  uVar10 = (this->kernel_h + -1) * this->dilation_h;
  Mat::Mat(&bottom_blob_unbordered,bottom_blob);
  if ((_elemsize != 1 & this->use_int8_inference) == 1) {
    bottom_blob_int8.dims = 0;
    bottom_blob_int8.w = 0;
    bottom_blob_int8.h = 0;
    bottom_blob_int8.c = 0;
    bottom_blob_int8.elemsize = 0;
    bottom_blob_int8.allocator = (Allocator *)0x0;
    bottom_blob_int8.data = (void *)0x0;
    bottom_blob_int8.refcount = (int *)0x0;
    bottom_blob_int8.cstep = 0;
    Mat::create(&bottom_blob_int8,iVar28,iVar31,iVar18,1,opt->workspace_allocator);
    if ((bottom_blob_int8.data == (void *)0x0) ||
       ((long)bottom_blob_int8.c * bottom_blob_int8.cstep == 0)) {
      Mat::~Mat(&bottom_blob_int8);
      iVar31 = -100;
      goto LAB_0012c02f;
    }
    iVar26 = this->group;
    iVar4 = iVar18 / iVar26;
    iVar29 = 0;
    for (lVar33 = 0; lVar33 < iVar26; lVar33 = lVar33 + 1) {
      uVar5._0_1_ = opt->lightmode;
      uVar5._1_3_ = *(undefined3 *)&opt->field_0x1;
      uVar5._4_4_ = opt->num_threads;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(1,(int)uVar5);
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)bottom_blob_int8.allocator;
      Mat::channel_range(&bottom_blob_g,bottom_blob,iVar29,iVar4);
      Mat::channel_range(&bottom_blob_int8_g,&bottom_blob_int8,iVar29,iVar4);
      pLVar1 = (this->quantize_ops).
               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar33];
      (*pLVar1->_vptr_Layer[5])(pLVar1,&bottom_blob_g,&bottom_blob_int8_g,&_space_ofs);
      Mat::~Mat(&bottom_blob_int8_g);
      Mat::~Mat(&bottom_blob_g);
      iVar26 = this->group;
      iVar29 = iVar29 + iVar4;
    }
    Mat::operator=(&bottom_blob_unbordered,&bottom_blob_int8);
    Mat::~Mat(&bottom_blob_int8);
  }
  bottom_blob_int8.refcount = bottom_blob_unbordered.refcount;
  bottom_blob_int8.data = bottom_blob_unbordered.data;
  bottom_blob_int8.allocator = bottom_blob_unbordered.allocator;
  bottom_blob_int8.elemsize = bottom_blob_unbordered.elemsize;
  if (bottom_blob_unbordered.refcount != (int *)0x0) {
    LOCK();
    *bottom_blob_unbordered.refcount = *bottom_blob_unbordered.refcount + 1;
    UNLOCK();
  }
  bottom_blob_int8.w = bottom_blob_unbordered.w;
  bottom_blob_int8.dims = bottom_blob_unbordered.dims;
  bottom_blob_int8.h = bottom_blob_unbordered.h;
  bottom_blob_int8.c = bottom_blob_unbordered.c;
  bottom_blob_int8.cstep = bottom_blob_unbordered.cstep;
  iVar26 = this->pad_w;
  iVar4 = this->pad_h;
  if (iVar4 < 1 && iVar26 < 1) {
    if (iVar4 == -0xe9 && iVar26 == -0xe9) {
      iVar26 = uVar9 - (iVar28 + -1) % this->stride_w;
      iVar28 = uVar10 - (iVar31 + -1) % this->stride_h;
      if ((0 < iVar26) || (0 < iVar28)) {
        copy_make_border(&bottom_blob_unbordered,&bottom_blob_int8,iVar28 / 2,iVar28 - iVar28 / 2,
                         iVar26 / 2,iVar26 - iVar26 / 2,0,0.0,opt->workspace_allocator,
                         opt->num_threads);
        goto LAB_0012b3f2;
      }
      iVar31 = bottom_blob_unbordered.h;
      iVar28 = bottom_blob_unbordered.w;
    }
LAB_0012b4a5:
    iVar26 = (int)(~uVar9 + iVar28) / this->stride_w;
    iVar29 = iVar26 + 1;
    iVar4 = (int)(~uVar10 + iVar31) / this->stride_h;
    Mat::create(top_blob,iVar29,iVar4 + 1,this->num_output,_elemsize,opt->blob_allocator);
    iVar31 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar9 = this->kernel_w * this->kernel_h;
      __n = (size_type)(int)uVar9;
      std::vector<int,_std::allocator<int>_>::vector
                (&_space_ofs,__n,(allocator_type *)&bottom_blob_g);
      piVar8 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar31 = this->dilation_h;
      iVar11 = this->kernel_w;
      iVar12 = this->dilation_w * iVar11;
      iVar17 = 0;
      lVar33 = 0;
      for (iVar13 = 0; iVar13 < this->kernel_h; iVar13 = iVar13 + 1) {
        for (lVar24 = 0; (int)lVar24 < iVar11; lVar24 = lVar24 + 1) {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[(int)lVar33 + lVar24] = iVar17;
          iVar17 = iVar17 + this->dilation_w;
          iVar11 = this->kernel_w;
        }
        iVar17 = iVar17 + (iVar28 * iVar31 - iVar12);
        lVar33 = (int)lVar33 + lVar24;
      }
      iVar28 = this->num_output;
      iVar31 = this->group;
      lVar33 = (long)iVar29;
      lVar24 = (long)iVar26;
      if (this->use_int8_inference == false) {
        if (iVar31 != iVar28 || iVar18 != iVar31) {
          uVar10 = iVar28 / iVar31;
          iVar26 = (int)((long)iVar18 / (long)iVar31);
          iVar28 = 0;
          uVar27 = 0;
          if (0 < (int)uVar9) {
            uVar27 = (ulong)uVar9;
          }
          uVar14 = 0;
          if (0 < iVar26) {
            uVar14 = (long)iVar18 / (long)iVar31 & 0xffffffff;
          }
          uVar32 = 0;
          if (0 < (int)uVar10) {
            uVar32 = (ulong)uVar10;
          }
          for (lVar20 = 0; lVar20 < iVar31; lVar20 = lVar20 + 1) {
            lVar30 = (long)iVar28 << 2;
            for (uVar34 = 0; uVar34 != uVar32; uVar34 = uVar34 + 1) {
              lVar25 = lVar20 * (int)uVar10 + uVar34;
              Mat::channel(&bottom_blob_g,top_blob,(int)lVar25);
              local_198 = bottom_blob_g.data;
              Mat::~Mat(&bottom_blob_g);
              pvVar21 = (this->weight_data).data;
              for (iVar18 = 0; iVar18 <= iVar4; iVar18 = iVar18 + 1) {
                for (lVar19 = 0; lVar19 <= lVar24; lVar19 = lVar19 + 1) {
                  if (this->bias_term == 0) {
                    fVar35 = 0.0;
                  }
                  else {
                    fVar35 = *(float *)((long)(this->bias_data).data + lVar25 * 4);
                  }
                  lVar22 = (long)pvVar21 + lVar30;
                  for (uVar15 = 0; uVar15 != uVar14; uVar15 = uVar15 + 1) {
                    bottom_blob_g.data =
                         (void *)((lVar20 * iVar26 + uVar15) * bottom_blob_int8.cstep *
                                  bottom_blob_int8.elemsize + (long)bottom_blob_int8.data);
                    bottom_blob_g.refcount = (int *)0x0;
                    bottom_blob_g.elemsize = bottom_blob_int8.elemsize;
                    bottom_blob_g.allocator = bottom_blob_int8.allocator;
                    bottom_blob_g.dims = 2;
                    bottom_blob_g.w = bottom_blob_int8.w;
                    bottom_blob_g.h = bottom_blob_int8.h;
                    bottom_blob_g.c = 1;
                    bottom_blob_g.cstep = (size_t)(bottom_blob_int8.h * bottom_blob_int8.w);
                    for (uVar16 = 0; uVar27 != uVar16; uVar16 = uVar16 + 1) {
                      fVar35 = fVar35 + *(float *)(lVar22 + uVar16 * 4) *
                                        *(float *)((long)bottom_blob_g.data +
                                                  (long)piVar8[uVar16] * 4 +
                                                  (long)this->stride_w * (long)(int)lVar19 * 4 +
                                                  (long)(bottom_blob_int8.w * iVar18 *
                                                        this->stride_h) * 4);
                    }
                    Mat::~Mat(&bottom_blob_g);
                    lVar22 = lVar22 + __n * 4;
                  }
                  *(float *)((long)local_198 + lVar19 * 4) = fVar35;
                }
                local_198 = (void *)((long)local_198 + lVar33 * 4);
              }
              lVar30 = lVar30 + (long)(int)(iVar26 * uVar9) * 4;
            }
            iVar31 = this->group;
            iVar28 = iVar28 + uVar10 * iVar26 * uVar9;
          }
        }
        else {
          local_200 = 0;
          uVar27 = 0;
          if (0 < (int)uVar9) {
            uVar27 = (ulong)uVar9;
          }
          for (lVar20 = 0; lVar20 < iVar18; lVar20 = lVar20 + 1) {
            Mat::channel(&bottom_blob_g,top_blob,(int)lVar20);
            pvVar21 = bottom_blob_g.data;
            Mat::~Mat(&bottom_blob_g);
            pvVar2 = (this->weight_data).data;
            bottom_blob_g.data =
                 (void *)(bottom_blob_int8.cstep * lVar20 * bottom_blob_int8.elemsize +
                         (long)bottom_blob_int8.data);
            bottom_blob_g.refcount = (int *)0x0;
            bottom_blob_g.elemsize = bottom_blob_int8.elemsize;
            bottom_blob_g.allocator = bottom_blob_int8.allocator;
            bottom_blob_g.dims = 2;
            bottom_blob_g.w = bottom_blob_int8.w;
            bottom_blob_g.h = bottom_blob_int8.h;
            bottom_blob_g.c = 1;
            bottom_blob_g.cstep = (size_t)(bottom_blob_int8.h * bottom_blob_int8.w);
            for (iVar18 = 0; iVar18 <= iVar4; iVar18 = iVar18 + 1) {
              iVar28 = this->bias_term;
              pvVar3 = (this->bias_data).data;
              iVar31 = this->stride_h;
              iVar26 = this->stride_w;
              for (lVar30 = 0; lVar30 <= lVar24; lVar30 = lVar30 + 1) {
                if (iVar28 == 0) {
                  fVar35 = 0.0;
                }
                else {
                  fVar35 = *(float *)((long)pvVar3 + lVar20 * 4);
                }
                for (uVar14 = 0; uVar27 != uVar14; uVar14 = uVar14 + 1) {
                  fVar35 = fVar35 + *(float *)((long)pvVar2 + uVar14 * 4 + local_200) *
                                    *(float *)((long)bottom_blob_g.data +
                                              (long)piVar8[uVar14] * 4 +
                                              lVar30 * iVar26 * 4 +
                                              (long)(iVar18 * bottom_blob_int8.w * iVar31) * 4);
                }
                *(float *)((long)pvVar21 + lVar30 * 4) = fVar35;
              }
              pvVar21 = (void *)((long)pvVar21 + lVar33 * 4);
            }
            Mat::~Mat(&bottom_blob_g);
            iVar18 = this->group;
            local_200 = local_200 + __n * 4;
          }
        }
      }
      else {
        lVar20 = 0;
        uVar10 = 0;
        if (0 < (int)uVar9) {
          uVar10 = uVar9;
        }
        if (iVar31 != iVar28 || iVar18 != iVar31) {
          uVar23 = iVar18 / iVar31;
          iVar18 = (int)((long)iVar28 / (long)iVar31);
          uVar27 = 0;
          if (0 < (int)uVar23) {
            uVar27 = (ulong)uVar23;
          }
          uVar14 = 0;
          if (0 < iVar18) {
            uVar14 = (long)iVar28 / (long)iVar31 & 0xffffffff;
          }
          for (; lVar20 < iVar31; lVar20 = lVar20 + 1) {
            for (uVar32 = 0; uVar32 != uVar14; uVar32 = uVar32 + 1) {
              Mat::channel(&bottom_blob_g,top_blob,(int)lVar20 * iVar18 + (int)uVar32);
              local_198 = bottom_blob_g.data;
              Mat::~Mat(&bottom_blob_g);
              pvVar21 = (this->weight_data).data;
              for (iVar28 = 0; iVar28 <= iVar4; iVar28 = iVar28 + 1) {
                for (lVar30 = 0; lVar30 <= lVar24; lVar30 = lVar30 + 1) {
                  iVar31 = 0;
                  lVar25 = (long)pvVar21 +
                           uVar32 * (long)(int)(uVar9 * uVar23) +
                           (long)(int)(iVar18 * uVar9 * uVar23 * (int)lVar20);
                  for (uVar34 = 0; uVar34 != uVar27; uVar34 = uVar34 + 1) {
                    bottom_blob_g.data =
                         (void *)((lVar20 * (int)uVar23 + uVar34) * bottom_blob_int8.cstep *
                                  bottom_blob_int8.elemsize + (long)bottom_blob_int8.data);
                    bottom_blob_g.refcount = (int *)0x0;
                    bottom_blob_g.elemsize = bottom_blob_int8.elemsize;
                    bottom_blob_g.allocator = bottom_blob_int8.allocator;
                    bottom_blob_g.dims = 2;
                    bottom_blob_g.w = bottom_blob_int8.w;
                    bottom_blob_g.h = bottom_blob_int8.h;
                    bottom_blob_g.c = 1;
                    bottom_blob_g.cstep = (size_t)(bottom_blob_int8.h * bottom_blob_int8.w);
                    for (uVar15 = 0; uVar10 != uVar15; uVar15 = uVar15 + 1) {
                      iVar31 = iVar31 + (int)*(char *)(lVar25 + uVar15) *
                                        (int)*(char *)((long)bottom_blob_g.data +
                                                      (long)piVar8[uVar15] +
                                                      (long)this->stride_w * (long)(int)lVar30 +
                                                      (long)(bottom_blob_int8.w * iVar28 *
                                                            this->stride_h));
                    }
                    lVar25 = lVar25 + __n;
                    Mat::~Mat(&bottom_blob_g);
                  }
                  *(int *)((long)local_198 + lVar30 * 4) = iVar31;
                }
                local_198 = (void *)((long)local_198 + lVar33 * 4);
              }
            }
            iVar31 = this->group;
          }
          iVar28 = 0;
          for (lVar33 = 0; lVar33 < iVar31; lVar33 = lVar33 + 1) {
            uVar7._0_1_ = opt->lightmode;
            uVar7._1_3_ = *(undefined3 *)&opt->field_0x1;
            uVar7._4_4_ = opt->num_threads;
            bottom_blob_int8_g.elemsize = (size_t)opt->workspace_allocator;
            bottom_blob_int8_g.data = (void *)CONCAT44(1,(int)uVar7);
            bottom_blob_int8_g.refcount = (int *)top_blob->allocator;
            Mat::channel_range(&bottom_blob_g,top_blob,iVar28,iVar18);
            pLVar1 = (this->dequantize_ops).
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar33];
            (*pLVar1->_vptr_Layer[7])(pLVar1,&bottom_blob_g,&bottom_blob_int8_g);
            Mat::~Mat(&bottom_blob_g);
            iVar31 = this->group;
            iVar28 = iVar28 + iVar18;
          }
        }
        else {
          lVar30 = 0;
          for (lVar20 = 0; lVar20 < iVar18; lVar20 = lVar20 + 1) {
            Mat::channel(&bottom_blob_g,top_blob,(int)lVar20);
            pvVar21 = bottom_blob_g.data;
            Mat::~Mat(&bottom_blob_g);
            pvVar2 = (this->weight_data).data;
            bottom_blob_g.data =
                 (void *)(bottom_blob_int8.cstep * lVar20 * bottom_blob_int8.elemsize +
                         (long)bottom_blob_int8.data);
            bottom_blob_g.refcount = (int *)0x0;
            bottom_blob_g.elemsize = bottom_blob_int8.elemsize;
            bottom_blob_g.allocator = bottom_blob_int8.allocator;
            bottom_blob_g.dims = 2;
            bottom_blob_g.w = bottom_blob_int8.w;
            bottom_blob_g.h = bottom_blob_int8.h;
            bottom_blob_g.c = 1;
            bottom_blob_g.cstep = (size_t)(bottom_blob_int8.h * bottom_blob_int8.w);
            for (iVar18 = 0; iVar18 <= iVar4; iVar18 = iVar18 + 1) {
              for (lVar25 = 0; lVar25 <= lVar24; lVar25 = lVar25 + 1) {
                iVar28 = 0;
                for (uVar27 = 0; uVar10 != uVar27; uVar27 = uVar27 + 1) {
                  iVar28 = iVar28 + (int)*(char *)((long)pvVar2 + uVar27 + lVar30) *
                                    (int)*(char *)((long)bottom_blob_g.data +
                                                  (long)piVar8[uVar27] +
                                                  (long)bottom_blob_int8.w *
                                                  (long)this->stride_h * (long)iVar18 +
                                                  (long)(int)lVar25 * (long)this->stride_w);
                }
                *(int *)((long)pvVar21 + lVar25 * 4) = iVar28;
              }
              pvVar21 = (void *)((long)pvVar21 + lVar33 * 4);
            }
            uVar6._0_1_ = opt->lightmode;
            uVar6._1_3_ = *(undefined3 *)&opt->field_0x1;
            uVar6._4_4_ = opt->num_threads;
            opt_g_1.workspace_allocator = opt->workspace_allocator;
            opt_g_1._0_4_ = SUB84(uVar6,0);
            opt_g_1.num_threads = 1;
            opt_g_1.blob_allocator = top_blob->allocator;
            Mat::channel_range(&bottom_blob_int8_g,top_blob,(int)lVar20,1);
            pLVar1 = (this->dequantize_ops).
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar20];
            (*pLVar1->_vptr_Layer[7])(pLVar1,&bottom_blob_int8_g,&opt_g_1);
            Mat::~Mat(&bottom_blob_int8_g);
            Mat::~Mat(&bottom_blob_g);
            iVar18 = this->group;
            lVar30 = lVar30 + __n;
          }
        }
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
      iVar31 = 0;
    }
  }
  else {
    copy_make_border(&bottom_blob_unbordered,&bottom_blob_int8,iVar4,iVar4,iVar26,iVar26,0,0.0,
                     opt->workspace_allocator,opt->num_threads);
LAB_0012b3f2:
    iVar31 = -100;
    if ((bottom_blob_int8.data != (void *)0x0) &&
       ((long)bottom_blob_int8.c * bottom_blob_int8.cstep != 0)) {
      iVar28 = bottom_blob_int8.w;
      iVar31 = bottom_blob_int8.h;
      goto LAB_0012b4a5;
    }
  }
  Mat::~Mat(&bottom_blob_int8);
LAB_0012c02f:
  Mat::~Mat(&bottom_blob_unbordered);
  return iVar31;
}

Assistant:

int ConvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

//     fprintf(stderr, "ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        const int channels_g = channels / group;

        // quantize, scale and round to nearest
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            ncnn::Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            const Mat bottom_blob_g = bottom_blob.channel_range(channels_g * g, channels_g);
            Mat bottom_blob_int8_g = bottom_blob_int8.channel_range(channels_g * g, channels_g);
            quantize_ops[g]->forward(bottom_blob_g, bottom_blob_int8_g, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;
    }

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    if (use_int8_inference)
    {
        // depth-wise
        if (channels == group && group == num_output)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g=0; g<group; g++)
            {
                int* outptr = top_blob.channel(g);
                const signed char* kptr = (const signed char*)weight_data + maxk * g;
                const Mat m = bottom_blob_bordered.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        int sum = 0;

                        const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                        for (int k = 0; k < maxk; k++)
                        {
                            signed char val = sptr[ space_ofs[k] ];
                            signed char w = kptr[k];
                            sum += val * w;
                        }

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }

                // dequantize, reverse scale inplace
                {
                    ncnn::Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    Mat top_blob_g = top_blob.channel_range(g, 1);
                    dequantize_ops[g]->forward_inplace(top_blob_g, opt_g);
                }
            }
        }
        else
        {
            const int channels_g = channels / group;
            const int num_output_g = num_output / group;

#ifdef _WIN32
            #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
            #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
            for (int g=0; g<group; g++)
            {
                for (int p=0; p<num_output_g; p++)
                {
                    int* outptr = top_blob.channel(g * num_output_g + p);
                    const signed char* weight_data_ptr = (const signed char*)weight_data + maxk * channels_g * num_output_g * g;

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* kptr = weight_data_ptr + maxk * channels_g * p;

                            // channels_g
                            for (int q=0; q<channels_g; q++)
                            {
                                const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                                const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                                for (int k = 0; k < maxk; k++)
                                {
                                    signed char val = sptr[ space_ofs[k] ];
                                    signed char w = kptr[k];
                                    sum += val * w;
                                }

                                kptr += maxk;
                            }

                            outptr[j] = sum;
                        }

                        outptr += outw;
                    }
                }
            }

            // dequantize, reverse scale inplace
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g=0; g<group; g++)
            {
                ncnn::Option opt_g = opt;
                opt_g.num_threads = 1;
                opt_g.blob_allocator = top_blob.allocator;

                Mat top_blob_g = top_blob.channel_range(num_output_g * g, num_output_g);
                dequantize_ops[g]->forward_inplace(top_blob_g, opt_g);
            }
        }

        return 0;
    }

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[g];

                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        float w = kptr[k];
                        sum += val * w;
                    }

                    outptr[j] = sum;
                }

                outptr += outw;
            }
        }

        return 0;
    }

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

#ifdef _WIN32
    #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
    #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
    for (int g=0; g<group; g++)
    {
        for (int p=0; p<num_output_g; p++)
        {
            float* outptr = top_blob.channel(g * num_output_g + p);
            const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[num_output_g * g + p];

                    const float* kptr = weight_data_ptr + maxk * channels_g * p;

                    // channels_g
                    for (int q=0; q<channels_g; q++)
                    {
                        const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                        const float* sptr = m.row(i*stride_h) + j*stride_w;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[ space_ofs[k] ];
                            float w = kptr[k];
                            sum += val * w;
                        }

                        kptr += maxk;
                    }

                    outptr[j] = sum;
                }

                outptr += outw;
            }
        }
    }

    return 0;
}